

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O2

void __thiscall
Potassco::SmodelsOutput::rule
          (SmodelsOutput *this,Head_t ht,AtomSpan *head,Weight_t bound,WeightLitSpan *body)

{
  int rt;
  char *exp;
  uint line;
  char *fmt;
  AtomSpan local_40;
  
  if (this->sec_ == 0) {
    if (head->size == 0) {
      if (this->false_ != 0) {
        local_40.first = &this->false_;
        this->fHead_ = true;
        local_40.size = 1;
        rule(this,ht,&local_40,bound,body);
        return;
      }
      exp = "false_ != 0";
      fmt = "empty head requires false atom";
      line = 0x147;
    }
    else {
      rt = isSmodelsRule(ht,head,bound,body);
      if (rt != 0) {
        startRule(this,rt);
        add(this,ht,head);
        add(this,bound,body,rt == 2);
        endRule(this);
        return;
      }
      exp = "rt != End";
      fmt = "unsupported rule type";
      line = 0x14c;
    }
  }
  else {
    exp = "sec_ == 0";
    fmt = "adding rules after symbols not supported";
    line = 0x145;
  }
  fail(-2,
       "virtual void Potassco::SmodelsOutput::rule(Head_t, const AtomSpan &, Weight_t, const WeightLitSpan &)"
       ,line,exp,fmt,0);
}

Assistant:

void SmodelsOutput::rule(Head_t ht, const AtomSpan& head, Weight_t bound, const WeightLitSpan& body) {
	POTASSCO_REQUIRE(sec_ == 0, "adding rules after symbols not supported");
	if (empty(head)) {
		POTASSCO_REQUIRE(false_ != 0, "empty head requires false atom");
		fHead_ = true;
		return SmodelsOutput::rule(ht, toSpan(&false_, 1), bound, body);
	}
	SmodelsRule rt = (SmodelsRule)isSmodelsRule(ht, head, bound, body);
	POTASSCO_REQUIRE(rt != End, "unsupported rule type");
	startRule(rt).add(ht, head).add(bound, body, rt == Cardinality).endRule();
}